

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O2

void NGA_Sprs_array_column_distribution(int s_a,int iproc,int *lo,int *hi)

{
  Integer ihi;
  Integer ilo;
  int local_30 [2];
  int local_28 [2];
  
  pnga_sprs_array_column_distribution((long)s_a,(long)iproc,(Integer *)local_28,(Integer *)local_30)
  ;
  *lo = local_28[0];
  *hi = local_30[0];
  return;
}

Assistant:

void NGA_Sprs_array_column_distribution(int s_a, int iproc, int *lo, int *hi)
{
  Integer sa = (Integer)s_a;
  Integer ip = (Integer)iproc;
  Integer ilo, ihi;
  wnga_sprs_array_column_distribution(sa,ip,&ilo,&ihi);
  *lo = (int)ilo;
  *hi = (int)ihi;
}